

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

void __thiscall
LogicalOperationNode::LogicalOperationNode
          (LogicalOperationNode *this,LogicalOperation operation_to,shared_ptr<Node> *lhs,
          shared_ptr<Node> *rhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR_Evaluate_00118c48;
  this->operation = operation_to;
  (this->lhs_node).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (lhs->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (lhs->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->lhs_node).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->rhs_node).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (rhs->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (rhs->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->rhs_node).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      return;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  return;
}

Assistant:

LogicalOperationNode::LogicalOperationNode(const LogicalOperation operation_to,
                                           const shared_ptr<Node> &lhs, const shared_ptr<Node> &rhs)
        : operation(operation_to)
        , lhs_node(lhs)
        , rhs_node(rhs)
    {}